

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  byte bVar1;
  FuncState *pFVar2;
  lua_State *L_00;
  GCObject *o;
  Proto *pPVar3;
  int iVar4;
  Node *pNVar5;
  TString *pTVar6;
  long lVar7;
  int iVar8;
  lua_State *L;
  FuncState *fs;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_88;
  FuncState local_78;
  
  pFVar2 = ls->fs;
  L_00 = ls->L;
  o = (GCObject *)pFVar2->f;
  iVar4 = (o->p).sizep;
  lVar7 = (long)iVar4;
  if (iVar4 <= pFVar2->np) {
    pNVar5 = (Node *)luaM_growaux_(L_00,(o->h).node,&(o->p).sizep,8,0x3ffff,"functions");
    (o->h).node = pNVar5;
    iVar8 = (o->p).sizep;
    if (iVar4 < iVar8) {
      do {
        (&(((o->h).node)->i_val).value_)[lVar7].gc = (GCObject *)0x0;
        lVar7 = lVar7 + 1;
      } while (iVar8 != lVar7);
    }
  }
  local_78.f = luaF_newproto(L_00);
  pNVar5 = (o->h).node;
  iVar4 = pFVar2->np;
  pFVar2->np = iVar4 + 1;
  (&(pNVar5->i_val).value_)[iVar4].gc = (GCObject *)local_78.f;
  if (((((GCheader *)local_78.f)->marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrier_(L_00,o,(GCObject *)local_78.f);
  }
  (local_78.f)->linedefined = line;
  open_func(ls,&local_78,&local_88);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar6 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar6);
    adjustlocalvars((LexState *)ls->fs,1);
  }
  pFVar2 = ls->fs;
  pPVar3 = pFVar2->f;
  pPVar3->is_vararg = '\0';
  iVar4 = (ls->t).token;
  iVar8 = 0;
  if (iVar4 != 0x29) {
    iVar8 = 0;
    while (iVar4 == 0x120) {
      pTVar6 = str_checkname(ls);
      new_localvar(ls,pTVar6);
      if ((pPVar3->is_vararg != '\0') || ((ls->t).token != 0x2c)) {
        iVar8 = iVar8 + 1;
        goto LAB_0010cb91;
      }
      luaX_next(ls);
      iVar8 = iVar8 + 1;
      iVar4 = (ls->t).token;
    }
    if (iVar4 != 0x118) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    pPVar3->is_vararg = '\x01';
  }
LAB_0010cb91:
  adjustlocalvars((LexState *)ls->fs,iVar8);
  bVar1 = pFVar2->nactvar;
  pPVar3->numparams = bVar1;
  luaK_reserveregs(pFVar2,(uint)bVar1);
  checknext(ls,0x29);
  statlist(ls);
  (local_78.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x106,0x109,line);
  pFVar2 = ls->fs->prev;
  iVar4 = luaK_codeABx(pFVar2,OP_CLOSURE,0,pFVar2->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOCABLE;
  (e->u).info = iVar4;
  luaK_exp2nextreg(pFVar2,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  `(' parlist `)' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}